

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall BufferTest_VirtualDtor_Test::TestBody(BufferTest_VirtualDtor_Test *this)

{
  dying_buffer *this_00;
  basic_buffer<int> *buffer;
  stict_mock_buffer *mock_buffer;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  int in_stack_000000d4;
  char *in_stack_000000d8;
  MockSpec<void_()> *in_stack_000000e0;
  StrictMock<dying_buffer> *in_stack_ffffffffffffffe0;
  
  this_00 = (dying_buffer *)operator_new(0x78);
  testing::StrictMock<dying_buffer>::StrictMock(in_stack_ffffffffffffffe0);
  dying_buffer::gmock_die(this_00);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,
             in_stack_000000c0);
  if (this_00 != (dying_buffer *)0x0) {
    (*(this_00->super_test_buffer<int>).super_basic_buffer<int>._vptr_basic_buffer[2])();
  }
  return;
}

Assistant:

TEST(BufferTest, VirtualDtor) {
  typedef StrictMock<dying_buffer> stict_mock_buffer;
  stict_mock_buffer *mock_buffer = new stict_mock_buffer();
  EXPECT_CALL(*mock_buffer, die());
  basic_buffer<int> *buffer = mock_buffer;
  delete buffer;
}